

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  ImGuiContext *pIVar1;
  uint in_EDX;
  float thickness;
  ImVec2 *in_RSI;
  ImGuiTabBar *in_RDI;
  float fVar2;
  float _y;
  ImGuiPtrOrIndex IVar3;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPtrOrIndex *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  ImGuiID in_stack_ffffffffffffff74;
  float fVar4;
  ImVector<ImGuiPtrOrIndex> *pIVar5;
  float in_stack_ffffffffffffff8c;
  ImVec2 in_stack_ffffffffffffff90;
  ImVec2 local_58;
  ImVec2 *local_50;
  ImU32 in_stack_ffffffffffffffbc;
  ImVec2 *p2;
  float fVar6;
  undefined4 in_stack_ffffffffffffffcc;
  ImGuiWindow *this;
  uint local_1c;
  bool local_1;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    if ((in_EDX & 0x100000) == 0) {
      PushOverrideID(in_stack_ffffffffffffff74);
    }
    pIVar5 = &pIVar1->CurrentTabBarStack;
    IVar3 = GetTabBarRefFromTabBar
                      ((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    local_50 = (ImVec2 *)IVar3.Ptr;
    thickness = (float)IVar3.Index;
    p2 = local_50;
    fVar6 = thickness;
    ImVector<ImGuiPtrOrIndex>::push_back
              ((ImVector<ImGuiPtrOrIndex> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    pIVar1->CurrentTabBar = in_RDI;
    if (in_RDI->CurrFrameVisible == pIVar1->FrameCount) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x19cf,
                    "bool ImGui::BeginTabBarEx(ImGuiTabBar *, const ImRect &, ImGuiTabBarFlags)");
    }
    if (((((in_EDX & 1) != 0) && ((in_RDI->Flags & 1U) == 0)) && (1 < (in_RDI->Tabs).Size)) &&
       (in_RDI->PrevFrameVisible != -1)) {
      qsort((in_RDI->Tabs).Data,(long)(in_RDI->Tabs).Size,0x20,TabItemComparerByVisibleOffset);
    }
    local_1c = in_EDX;
    if ((in_EDX & 0xc0) == 0) {
      local_1c = in_EDX | 0x40;
    }
    in_RDI->Flags = local_1c;
    (in_RDI->BarRect).Min = *in_RSI;
    (in_RDI->BarRect).Max = in_RSI[1];
    in_RDI->WantLayout = true;
    in_RDI->PrevFrameVisible = in_RDI->CurrFrameVisible;
    in_RDI->CurrFrameVisible = pIVar1->FrameCount;
    in_RDI->FramePadding = (pIVar1->Style).FramePadding;
    fVar4 = in_RDI->OffsetMaxIdeal;
    fVar2 = ImRect::GetHeight(&in_RDI->BarRect);
    ImVec2::ImVec2(&local_58,fVar4,fVar2);
    ItemSize((ImVec2 *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    (this->DC).CursorPos.x = (in_RDI->BarRect).Min.x;
    GetColorU32((ImGuiCol)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
    _y = (in_RDI->BarRect).Max.y - 1.0;
    fVar4 = (in_RDI->BarRect).Max.x;
    fVar2 = (this->WindowPadding).x;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,
                   (in_RDI->BarRect).Min.x - (float)(int)((this->WindowPadding).x * 0.5),_y);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,fVar4 + (float)(int)(fVar2 * 0.5),_y);
    ImDrawList::AddLine((ImDrawList *)this,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,fVar6),p2,
                        in_stack_ffffffffffffffbc,thickness);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(tab_bar->OffsetMaxIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}